

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAddPi(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pObj;
  char *format;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAVar2 != (Abc_Ntk_t *)0x0) {
      pAVar2 = Abc_NtkDup(pAVar2);
      if (pAVar2->vPis->nSize == 0) {
        pObj = Abc_NtkCreateObj(pAVar2,ABC_OBJ_PI);
        Abc_ObjAssignName(pObj,"dummy_pi",(char *)0x0);
        Abc_NtkOrderCisCos(pAVar2);
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    format = "Empty network.\n";
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: addpi [-h]\n");
    Abc_Print(-2,"\t         if the network has no PIs, add one dummy PI\n");
    format = "\t-h     : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandAddPi( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtkRes;
    int c;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkDup( pNtk );
    if ( Abc_NtkPiNum(pNtkRes) == 0 )
    {
        Abc_Obj_t * pObj = Abc_NtkCreatePi( pNtkRes );
        Abc_ObjAssignName( pObj, "dummy_pi", NULL );
        Abc_NtkOrderCisCos( pNtkRes );
    }
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: addpi [-h]\n" );
    Abc_Print( -2, "\t         if the network has no PIs, add one dummy PI\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}